

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_evaluate_nurbs.cpp
# Opt level: O2

bool ON_RemoveBezierSingAt0(int dim,int order,int cv_stride,double *cv)

{
  double dVar1;
  double *pdVar2;
  long lVar3;
  int order_00;
  ulong uVar4;
  long lVar5;
  double *pdVar6;
  long lVar7;
  bool bVar8;
  
  lVar3 = (long)dim;
  uVar4 = (ulong)order;
  while( true ) {
    dVar1 = cv[lVar3];
    if ((dVar1 != 0.0) || (NAN(dVar1))) break;
    if ((long)uVar4 < 3) goto LAB_0047f3ea;
    uVar4 = uVar4 - 1;
    lVar5 = lVar3;
    while (bVar8 = lVar5 != 0, lVar5 = lVar5 + -1, bVar8) {
      if ((cv[lVar5] != 0.0) || (NAN(cv[lVar5]))) goto LAB_0047f3ea;
    }
    lVar5 = 0;
    pdVar2 = cv;
    while (pdVar6 = pdVar2, lVar5 < (long)uVar4) {
      lVar5 = lVar5 + 1;
      pdVar2 = pdVar6 + cv_stride;
      for (lVar7 = 0; lVar7 <= lVar3; lVar7 = lVar7 + 1) {
        pdVar6[lVar7] = (pdVar2[lVar7] * (double)(int)uVar4) / (double)(int)lVar5;
      }
    }
  }
  while (order_00 = (int)uVar4, order_00 < order) {
    ON_IncreaseBezierDegree(dim,true,order_00,cv_stride,cv);
    uVar4 = (ulong)(order_00 + 1);
  }
LAB_0047f3ea:
  return (bool)(-(dVar1 != 0.0) & 1);
}

Assistant:

bool ON_RemoveBezierSingAt0(
                  int dim, 
                  int order, 
                  int cv_stride,
                  double* cv
                  )
{
  const int cvdim = dim+1;
  int j,k,ord0;
  ord0 = order;
  while(cv[dim] == 0.0) {
    order--; 
    if (order < 2)
      return false;
    j = dim; 
    while(j--) {
      if (cv[j] != 0.0) 
        return false;
    }
    for (j=0;  j<order;  j++) {
      for (k=0;  k<cvdim;  k++) 
        cv[j*cv_stride+k] = (order*cv[(j+1)*cv_stride+k])/(j+1);
    }
  }
  while (order < ord0)
    ON_IncreaseBezierDegree(dim,true,order++,cv_stride,cv);
  return true;
}